

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_list.c
# Opt level: O0

unsigned_long list_pop(list_s *lst)

{
  _list_node_s *p_Var1;
  list_node_s *next;
  unsigned_long value;
  list_s *lst_local;
  
  if ((lst == (list_s *)0x0) || (lst->tail == (list_node_s *)0x0)) {
    lst_local = (list_s *)0x0;
  }
  else {
    lst_local = (list_s *)lst->tail->value;
    if (lst->head == lst->tail) {
      if (lst->tail->key != (uchar *)0x0) {
        free(lst->tail->key);
        lst->tail->key = (uchar *)0x0;
      }
      free(lst->tail);
      lst->head = (list_node_s *)0x0;
      lst->tail = (list_node_s *)0x0;
    }
    else {
      p_Var1 = lst->tail->next;
      if (lst->tail->key != (uchar *)0x0) {
        free(lst->tail->key);
        lst->tail->key = (uchar *)0x0;
      }
      free(lst->tail);
      lst->tail = p_Var1;
    }
    lst->elements = lst->elements - 1;
  }
  return (unsigned_long)lst_local;
}

Assistant:

unsigned long list_pop(list_s *lst) {
    if (lst == NULL || lst->tail == NULL) {
        return 0;
    } else {
        unsigned long value = lst->tail->value;
        if (lst->head == lst->tail) { //if head = tail
            if (lst->tail->key != NULL) {
                free(lst->tail->key); //free key memory
                lst->tail->key = NULL; //set list_s key pointer to NULL
            }
            free(lst->tail); //free list_s element memory
            lst->head = NULL; //set list_s pointer to NULL
            lst->tail = NULL; //set list_s pointer to NULL
        } else {
            list_node_s *next = lst->tail->next;
            if (lst->tail->key != NULL) {
                free(lst->tail->key); //free key memory
                lst->tail->key = NULL; //set list_s key pointer to NULL
            }
            free(lst->tail);
            lst->tail = next;
        }
        --lst->elements;
        return value;
    }
}